

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
handle_exception(Try_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
                ,Dispatch_State *t_ss,Boxed_Value *t_except)

{
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node;
  Type_Conversions *pTVar1;
  Type_Conversions *pTVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pBVar5;
  undefined1 auVar6 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer ppVar8;
  pair<bool,_bool> pVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
  *type;
  undefined8 *puVar10;
  pointer ppVar11;
  eval_error *this_00;
  undefined8 *in_RCX;
  Dispatch_State *t_ss_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  ulong uVar13;
  ulong uVar14;
  Boxed_Value BVar15;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>
  __l;
  string name;
  allocator_type local_119;
  element_type *local_118;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *local_110;
  undefined1 local_108 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [2];
  File_Position local_d0;
  string local_c8;
  Boxed_Value local_a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  local_98;
  Type_Conversions_State *local_80;
  Boxed_Value *local_78;
  Function_Params local_70;
  Param_Types local_60;
  undefined1 local_40 [16];
  
  puVar10 = (undefined8 *)operator_new(0x50);
  puVar10[1] = 0x100000001;
  *puVar10 = &PTR___Sp_counted_ptr_inplace_003ce610;
  puVar10[2] = &Type_Info::Unknown_Type::typeinfo;
  puVar10[3] = &Type_Info::Unknown_Type::typeinfo;
  *(undefined4 *)(puVar10 + 4) = 0x20;
  *(undefined8 *)((long)puVar10 + 0x24) = 0;
  *(undefined8 *)((long)puVar10 + 0x2c) = 0;
  *(undefined8 *)((long)puVar10 + 0x34) = 0;
  *(undefined8 *)((long)puVar10 + 0x3c) = 0;
  *(undefined8 *)((long)puVar10 + 0x42) = 0;
  *(undefined8 **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node.identifier = puVar10;
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node = (_func_int **)(puVar10 + 2);
  pTVar1 = t_ss[2].m_conversions.m_conversions._M_data;
  pTVar2 = (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data;
  uVar14 = (long)pTVar2 - (long)pTVar1 >> 3;
  _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar2[-1].m_conversion_saves.m_key
  ;
  local_118 = (element_type *)this;
  local_d0 = (File_Position)t_ss;
  if ((_Var12._M_pi)->_M_use_count == 0x1d) {
    if (pTVar2 == pTVar1) {
      __assert_fail("end_point > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/chaiscript_eval.hpp"
                    ,0x4ee,
                    "Boxed_Value chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::handle_exception(const chaiscript::detail::Dispatch_State &, const Boxed_Value &) const [T = chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>]"
                   );
    }
    uVar14 = uVar14 - 1;
  }
  if (1 < uVar14) {
    local_78 = (Boxed_Value *)(in_RCX + 2);
    local_80 = (Type_Conversions_State *)(t_except + 1);
    uVar13 = 1;
    local_110 = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                t_except;
    do {
      chaiscript::detail::Dispatch_Engine::new_scope
                (*(Stack_Holder **)
                  &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      *)t_except)->super_AST_Node).identifier);
      lVar3 = *(long *)((long)&(((((Type_Conversions_State *)((long)local_d0 + 0x50))->m_conversions
                                 )._M_data)->m_mutex)._M_impl._M_rwlock + uVar13 * 8);
      puVar10 = *(undefined8 **)(lVar3 + 0x50);
      t_ss_00 = (Dispatch_State *)(*(long *)(lVar3 + 0x58) - (long)puVar10 >> 3);
      t_node = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               ((long)&t_ss_00[-1].m_conversions.m_saves._M_data + 6);
      if ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)0x1 <
          t_node) {
        if (t_ss_00 != (Dispatch_State *)0x1) {
          pBVar5 = ((reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *)
                   ((long)local_d0 + 0x58))->_M_data[-1].saves.
                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((*(int *)&(pBVar5->m_data).
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi == 0x1d) &&
             (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                        ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                          *)local_40,
                         (Dispatch_State *)
                         ((pBVar5[5].m_data.
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_type_info).m_type_info),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
          }
          this_00 = (eval_error *)__cxa_allocate_exception(0x90);
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"Internal error: catch block size unrecognized","");
          exception::eval_error::eval_error(this_00,(string *)local_108);
          __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *
                   )local_108,(Dispatch_State *)*puVar10);
        p_Var7 = p_Stack_100;
        auVar6 = local_108;
        local_108 = (undefined1  [8])0x0;
        p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      *)&local_118->m_type_info)->super_AST_Node).identifier;
        (((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
         &local_118->m_type_info)->super_AST_Node)._vptr_AST_Node = (_func_int **)auVar6;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
           &local_118->m_type_info)->super_AST_Node).identifier = p_Var7;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
           p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
        }
LAB_0034f506:
        chaiscript::detail::Dispatch_Engine::pop_scope
                  (*(Stack_Holder **)
                    &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                        *)t_except)->super_AST_Node).identifier);
        _Var12._M_pi = extraout_RDX_00;
        break;
      }
      Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
      get_arg_name_abi_cxx11_
                (&local_c8,
                 (Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                  *)*puVar10,t_node);
      Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
      get_arg_type_abi_cxx11_
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
                  *)local_108,
                 (Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                  *)**(undefined8 **)(lVar3 + 0x50),
                 (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 t_except,t_ss_00);
      __l._M_len = 1;
      __l._M_array = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
                      *)local_108;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ::vector(&local_98,__l,&local_119);
      ppVar8 = local_98.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar11 = local_98.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_60.m_types.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_98.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_60.m_types.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_60.m_types.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (; ppVar11 != ppVar8; ppVar11 = ppVar11 + 1) {
        if ((ppVar11->first)._M_string_length != 0) {
          local_60.m_has_types = true;
          goto LAB_0034f332;
        }
      }
      local_60.m_has_types = false;
LAB_0034f332:
      local_70.m_end = local_78;
      pVar9 = dispatch::Param_Types::match(&local_60,&local_70,local_80);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ::~vector(&local_60.m_types);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ::~vector(&local_98);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
      }
      t_except = (Boxed_Value *)local_110;
      if (((ushort)pVar9 & 1) != 0) {
        local_a8.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*in_RCX;
        local_a8.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
        if (local_a8.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_a8.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_a8.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        chaiscript::detail::Dispatch_State::add_object
                  ((Dispatch_State *)local_110,&local_c8,&local_a8);
        if (local_a8.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (*(long *)(lVar3 + 0x58) - *(long *)(lVar3 + 0x50) == 0x10) {
          AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                    ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      *)local_108,*(Dispatch_State **)(*(long *)(lVar3 + 0x50) + 8));
          p_Var7 = p_Stack_100;
          auVar6 = local_108;
          local_108 = (undefined1  [8])0x0;
          p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                        *)&local_118->m_type_info)->super_AST_Node).identifier;
          (((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
           &local_118->m_type_info)->super_AST_Node)._vptr_AST_Node = (_func_int **)auVar6;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             &local_118->m_type_info)->super_AST_Node).identifier = p_Var7;
          if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
             p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0034f506;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      chaiscript::detail::Dispatch_Engine::pop_scope
                (*(Stack_Holder **)
                  &(((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      *)t_except)->super_AST_Node).identifier);
      uVar13 = uVar13 + 1;
      _Var12._M_pi = extraout_RDX;
    } while (uVar13 != uVar14);
  }
  BVar15.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var12._M_pi;
  BVar15.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_118;
  return (Boxed_Value)
         BVar15.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value handle_exception(const chaiscript::detail::Dispatch_State &t_ss, const Boxed_Value &t_except) const {
        Boxed_Value retval;

        size_t end_point = this->children.size();
        if (this->children.back()->identifier == AST_Node_Type::Finally) {
          assert(end_point > 0);
          end_point = this->children.size() - 1;
        }
        for (size_t i = 1; i < end_point; ++i) {
          chaiscript::eval::detail::Scope_Push_Pop catch_scope(t_ss);
          auto &catch_block = *this->children[i];

          if (catch_block.children.size() == 1) {
            // No variable capture
            retval = catch_block.children[0]->eval(t_ss);
            break;
          } else if (catch_block.children.size() == 2 || catch_block.children.size() == 3) {
            const auto name = Arg_List_AST_Node<T>::get_arg_name(*catch_block.children[0]);

            if (dispatch::Param_Types(
                    std::vector<std::pair<std::string, Type_Info>>{Arg_List_AST_Node<T>::get_arg_type(*catch_block.children[0], t_ss)})
                    .match(Function_Params{t_except}, t_ss.conversions())
                    .first) {
              t_ss.add_object(name, t_except);

              if (catch_block.children.size() == 2) {
                // Variable capture
                retval = catch_block.children[1]->eval(t_ss);
                break;
              }
            }
          } else {
            if (this->children.back()->identifier == AST_Node_Type::Finally) {
              this->children.back()->children[0]->eval(t_ss);
            }
            throw exception::eval_error("Internal error: catch block size unrecognized");
          }
        }

        return retval;
      }